

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O1

void readJson(string *filename,
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *nonTerminalsV,
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *terminalsT,vector<Production_*,_std::allocator<Production_*>_> *productionsP,
             string *startS)

{
  char *pcVar1;
  iterator __position;
  Type pGVar2;
  Ch *pCVar3;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar4;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *pvVar5;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>> *this;
  Production *this_00;
  uint uVar6;
  uint index;
  string s;
  Production *production;
  Document pda_document;
  IStreamWrapper pda_stream_wrapper;
  ifstream pda_stream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_310;
  vector<Production*,std::allocator<Production*>> *local_308;
  Production *local_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  local_2e0;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> local_280;
  basic_istream<char,_std::char_traits<char>_> local_238 [520];
  
  std::ifstream::ifstream(local_238,(string *)filename,_S_in);
  local_280.buffer_ = local_280.peekBuffer_;
  local_280.bufferSize_ = 4;
  local_280.bufferLast_ = (Ch *)0x0;
  local_280.readCount_ = 0;
  local_280.count_ = 0;
  local_280.eof_ = false;
  local_280.stream_ = local_238;
  local_280.current_ = local_280.buffer_;
  rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read
            (&local_280);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument(&local_2e0,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  local_310 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)nonTerminalsV;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
  ::ParseStream<0u,rapidjson::UTF8<char>,rapidjson::BasicIStreamWrapper<std::istream>>
            ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
              *)&local_2e0,&local_280);
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)&local_2e0,"Start");
  pCVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(pGVar2);
  pcVar1 = (char *)startS->_M_string_length;
  strlen(pCVar3);
  std::__cxx11::string::_M_replace((ulong)startS,0,pcVar1,(ulong)pCVar3);
  local_308 = (vector<Production*,std::allocator<Production*>> *)productionsP;
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)&local_2e0,"Terminals");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)terminalsT,0,0);
  if ((pGVar2->data_).f.flags == 4) {
    uVar6 = 0;
    do {
      if ((pGVar2->data_).s.length <= uVar6) {
        pGVar2 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&local_2e0,"Variables");
        pvVar5 = local_310;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_assign_aux<std::__cxx11::string_const*>(local_310,0,0);
        if ((pGVar2->data_).f.flags == 4) {
          uVar6 = 0;
          goto LAB_0012cfc3;
        }
        break;
      }
      pGVar4 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::operator[](pGVar2,uVar6);
      pCVar3 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(pGVar4);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_330,pCVar3,(allocator<char> *)&local_2f8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)terminalsT,
                 &local_330);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != &local_330.field_2) {
        operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
      }
      uVar6 = uVar6 + 1;
    } while ((pGVar2->data_).f.flags == 4);
  }
  goto LAB_0012d179;
LAB_0012d05c:
  if (*(uint *)pvVar5 <= uVar6) {
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::~GenericDocument(&local_2e0);
    std::ifstream::~ifstream(local_238);
    return;
  }
  this = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
          *)rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::operator[]((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)pvVar5,uVar6);
  local_2f8 = 0;
  uStack_2f0 = 0;
  local_2e8 = 0;
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(this,"body");
  if ((pGVar2->data_).f.flags != 4) goto LAB_0012d179;
  index = 0;
  while (index < (pGVar2->data_).s.length) {
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator[](pGVar2,index);
    local_330._M_dataplus._M_p =
         rapidjson::
         GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
         ::GetString(pGVar4);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2f8,
               (char **)&local_330);
    index = index + 1;
    if ((pGVar2->data_).f.flags != 4) goto LAB_0012d179;
  }
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(this,"head");
  pCVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(pGVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,pCVar3,(allocator<char> *)&local_300);
  pvVar5 = local_310;
  this_00 = (Production *)operator_new(0x38);
  Production::Production
            (this_00,&local_330,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_2f8);
  __position._M_current = *(Production ***)(local_308 + 8);
  local_300 = this_00;
  if (__position._M_current == *(Production ***)(local_308 + 0x10)) {
    std::vector<Production*,std::allocator<Production*>>::_M_realloc_insert<Production*const&>
              (local_308,__position,&local_300);
  }
  else {
    *__position._M_current = this_00;
    *(long *)(local_308 + 8) = *(long *)(local_308 + 8) + 8;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2f8);
  uVar6 = uVar6 + 1;
  if (*(short *)(pvVar5 + 0xe) != 4) goto LAB_0012d179;
  goto LAB_0012d05c;
  while( true ) {
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator[](pGVar2,uVar6);
    pCVar3 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(pGVar4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_330,pCVar3,(allocator<char> *)&local_2f8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>(pvVar5,&local_330);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
    uVar6 = uVar6 + 1;
    if ((pGVar2->data_).f.flags != 4) break;
LAB_0012cfc3:
    if ((pGVar2->data_).s.length <= uVar6) {
      pvVar5 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)&local_2e0,"Productions");
      std::vector<Production*,std::allocator<Production*>>::_M_assign_aux<Production*const*>
                (local_308,0,0);
      if (*(short *)(pvVar5 + 0xe) == 4) {
        uVar6 = 0;
        local_310 = pvVar5;
        goto LAB_0012d05c;
      }
      break;
    }
  }
LAB_0012d179:
  __assert_fail("IsArray()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/arnodeceuninck[P]CLizard/src/indiv/rapidjson/document.h"
                ,0x61b,
                "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::Size() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

void readJson(std::string filename,
              std::vector<std::string> &nonTerminalsV,
              std::vector<std::string> &terminalsT,
              std::vector<Production *> &productionsP,
              std::string &startS) {

    // Read the file
    std::ifstream pda_stream(filename);
    rapidjson::IStreamWrapper pda_stream_wrapper(pda_stream);
    rapidjson::Document pda_document;
    pda_document.ParseStream(pda_stream_wrapper);

    startS = pda_document["Start"].GetString();

    // Terminals
    rapidjson::Value &terminals_value = pda_document["Terminals"];

    terminalsT = {};

    for (rapidjson::SizeType i = 0; i < terminals_value.Size(); i++) {
        std::string s = terminals_value[i].GetString();
        terminalsT.emplace_back(s);
    }

    // non-Terminals
    rapidjson::Value &nonterminals_value = pda_document["Variables"];

    nonTerminalsV = {};

    for (rapidjson::SizeType i = 0; i < nonterminals_value.Size(); i++) {
        std::string s = nonterminals_value[i].GetString();
        nonTerminalsV.emplace_back(s);
    }


    // Transitions
    rapidjson::Value &transitions_value = pda_document["Productions"];

    productionsP = {};

    for (rapidjson::SizeType i = 0; i < transitions_value.Size(); i++) {

        rapidjson::Value &transition = transitions_value[i];

        std::vector<std::string> replacement = {};
        rapidjson::Value &replacement_value = transition["body"];

        for (rapidjson::SizeType i = 0; i < replacement_value.Size(); i++) {
            replacement.emplace_back(replacement_value[i].GetString());
        }

        std::string inputStr = transition["head"].GetString();

        Production *production = new Production(inputStr, replacement);
        productionsP.push_back(production);
    }

}